

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut_widgets.cpp
# Opt level: O1

bool qWidgetShortcutContextMatcher(QObject *object,ShortcutContext context)

{
  QWidget *pQVar1;
  char cVar2;
  bool bVar3;
  undefined1 uVar4;
  QWidget *active_window;
  QWidget *pQVar5;
  long lVar6;
  long lVar7;
  QAction *a;
  QGraphicsWidget *w;
  QObject *pQVar8;
  
  active_window = QApplication::activeWindow();
  pQVar5 = QApplication::activePopupWidget();
  if (pQVar5 != (QWidget *)0x0) {
    active_window = QApplication::activePopupWidget();
  }
  if (active_window == (QWidget *)0x0) {
    lVar6 = QGuiApplication::focusWindow();
    if ((lVar6 == 0) || (cVar2 = QWindow::isActive(), cVar2 == '\0')) {
      active_window = (QWidget *)0x0;
    }
    else {
      active_window = (QWidget *)0x0;
      do {
        lVar7 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
        if (lVar7 != 0) {
          if ((*(long *)(lVar7 + 0x28) == 0) || (*(int *)(*(long *)(lVar7 + 0x28) + 4) == 0)) {
            active_window = (QWidget *)0x0;
          }
          else {
            active_window = *(QWidget **)(lVar7 + 0x30);
          }
        }
      } while ((lVar7 == 0) && (lVar6 = QWindow::parent(lVar6,0), lVar6 != 0));
    }
  }
  a = (QAction *)QMetaObject::cast((QObject *)&QAction::staticMetaObject);
  if (a == (QAction *)0x0) {
    w = (QGraphicsWidget *)QMetaObject::cast((QObject *)&QGraphicsWidget::staticMetaObject);
    if (w == (QGraphicsWidget *)0x0) {
      if (object == (QObject *)0x0) {
        pQVar5 = (QWidget *)0x0;
      }
      else {
        pQVar5 = (QWidget *)0x0;
        if ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0) {
          pQVar5 = (QWidget *)object;
        }
      }
      if (pQVar5 == (QWidget *)0x0) {
        lVar6 = QMetaObject::cast((QObject *)&QShortcut::staticMetaObject);
        if ((lVar6 == 0) ||
           (pQVar1 = *(QWidget **)(*(long *)(lVar6 + 8) + 0x10), pQVar1 == (QWidget *)0x0)) {
          pQVar5 = (QWidget *)0x0;
        }
        else {
          pQVar5 = (QWidget *)0x0;
          if ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x30) & 1) != 0) {
            pQVar5 = pQVar1;
          }
        }
      }
      if (pQVar5 == (QWidget *)0x0) {
        if (object == (QObject *)0x0) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = (QObject *)0x0;
          if ((*(byte *)(*(long *)(object + 8) + 0x30) & 0x40) != 0) {
            pQVar8 = object;
          }
        }
        pQVar5 = (QWidget *)0x0;
        for (; pQVar8 != (QObject *)0x0; pQVar8 = (QObject *)QWindow::parent(pQVar8,0)) {
          lVar6 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
          if (lVar6 != 0) {
            if ((*(long *)(lVar6 + 0x28) == 0) || (*(int *)(*(long *)(lVar6 + 0x28) + 4) == 0)) {
              pQVar5 = (QWidget *)0x0;
            }
            else {
              pQVar5 = *(QWidget **)(lVar6 + 0x30);
            }
          }
          if (lVar6 != 0) break;
        }
      }
      if (pQVar5 != (QWidget *)0x0) {
        bVar3 = correctWidgetContext(context,pQVar5,active_window);
        return bVar3;
      }
      uVar4 = QShortcutPrivate::simpleContextMatcher(object,context);
      return (bool)uVar4;
    }
    bVar3 = correctGraphicsWidgetContext(context,w,active_window);
  }
  else {
    bVar3 = correctActionContext(context,a,active_window);
  }
  return bVar3;
}

Assistant:

bool qWidgetShortcutContextMatcher(QObject *object, Qt::ShortcutContext context)
{
    Q_ASSERT_X(object, "QShortcutMap", "Shortcut has no owner. Illegal map state!");

    QWidget *active_window = QApplication::activeWindow();

    // popups do not become the active window,
    // so we fake it here to get the correct context
    // for the shortcut system.
    if (QApplication::activePopupWidget())
        active_window = QApplication::activePopupWidget();

    if (!active_window) {
        QWindow *qwindow = QGuiApplication::focusWindow();
        if (qwindow && qwindow->isActive()) {
            while (qwindow) {
                if (auto widgetWindow = qobject_cast<QWidgetWindow *>(qwindow)) {
                    active_window = widgetWindow->widget();
                    break;
                }
                qwindow = qwindow->parent();
            }
        }
    }

#if QT_CONFIG(action)
    if (auto a = qobject_cast<QAction *>(object))
        return correctActionContext(context, a, active_window);
#endif

#if QT_CONFIG(graphicsview)
    if (auto gw = qobject_cast<QGraphicsWidget *>(object))
        return correctGraphicsWidgetContext(context, gw, active_window);
#endif

    auto w = qobject_cast<QWidget *>(object);
    if (!w) {
        if (auto s = qobject_cast<QShortcut *>(object))
            w = qobject_cast<QWidget *>(s->parent());
    }

    if (!w) {
        auto qwindow = qobject_cast<QWindow *>(object);
        while (qwindow) {
            if (auto widget_window = qobject_cast<QWidgetWindow *>(qwindow)) {
                w = widget_window->widget();
                break;
            }
            qwindow = qwindow->parent();
        }
    }

    if (w)
        return correctWidgetContext(context, w, active_window);

    return QShortcutPrivate::simpleContextMatcher(object, context);
}